

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O3

int cfg_db_remove_element
              (cfg_db *db,char *section_type,char *section_name,char *entry_name,char *value)

{
  int iVar1;
  cfg_entry *entry;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  char *__s2;
  
  entry = cfg_db_find_entry(db,section_type,section_name,entry_name);
  iVar4 = -1;
  if (entry != (cfg_entry *)0x0) {
    pcVar2 = strarray_get(&entry->val,1);
    __s2 = (entry->val).value;
    if (pcVar2 == (char *)0x0) {
      iVar1 = strcmp(value,__s2);
      if (iVar1 == 0) {
        _free_entry(entry);
LAB_00148e7f:
        iVar4 = 0;
      }
    }
    else if (__s2 != (char *)0x0) {
      pcVar2 = __s2 + (entry->val).length;
      for (; __s2 < pcVar2; __s2 = __s2 + sVar3 + 1) {
        iVar1 = strcmp(__s2,value);
        if (iVar1 == 0) {
          strarray_remove_ext(&entry->val,__s2,true);
          goto LAB_00148e7f;
        }
        sVar3 = strlen(__s2);
      }
    }
  }
  return iVar4;
}

Assistant:

int
cfg_db_remove_element(
  struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name, const char *value) {
  struct cfg_entry *entry;
  char *ptr;

  /* find entry */
  entry = cfg_db_find_entry(db, section_type, section_name, entry_name);
  if (entry == NULL) {
    return -1;
  }

  if (!cfg_db_is_multipart_entry(entry)) {
    /* only a single element in list */
    if (strcmp(value, entry->val.value) == 0) {
      _free_entry(entry);
      return 0;
    }
    return -1;
  }

  strarray_for_each_element(&entry->val, ptr) {
    if (strcmp(ptr, value) == 0) {
      strarray_remove(&entry->val, ptr);
      return 0;
    }
  }

  /* element not in list */
  return -1;
}